

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,SPIRType *type,string *expr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  spirv_cross local_50 [32];
  ulong local_30;
  size_type end_array_index;
  size_type start_array_index;
  string *expr_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  if ((*(this->backend).nonuniform_qualifier != '\0') &&
     (((*(int *)&(type->super_IVariant).field_0xc == 0x12 ||
       (*(int *)&(type->super_IVariant).field_0xc == 0x11)) ||
      (*(int *)&(type->super_IVariant).field_0xc == 0x10)))) {
    start_array_index = (size_type)expr;
    expr_local = (string *)type;
    type_local = (SPIRType *)this;
    end_array_index = ::std::__cxx11::string::find_first_of((char)expr,0x5b);
    local_30 = ::std::__cxx11::string::find_last_of((char)start_array_index,0x5d);
    if (((end_array_index != 0xffffffffffffffff) && (local_30 != 0xffffffffffffffff)) &&
       (end_array_index <= local_30)) {
      end_array_index = end_array_index + 1;
      ::std::__cxx11::string::substr((ulong)local_70,start_array_index);
      ::std::__cxx11::string::substr((ulong)local_90,start_array_index);
      ::std::__cxx11::string::substr((ulong)local_c0,start_array_index);
      join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                (local_50,local_70,&(this->backend).nonuniform_qualifier,(char (*) [2])0x4f3f9c,
                 local_90,(char (*) [2])0x4dff7a,local_c0);
      ::std::__cxx11::string::operator=((string *)start_array_index,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__cxx11::string::~string((string *)local_c0);
      ::std::__cxx11::string::~string((string *)local_90);
      ::std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(const SPIRType &type, std::string &expr)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	// Handle SPV_EXT_descriptor_indexing.
	if (type.basetype == SPIRType::Sampler || type.basetype == SPIRType::SampledImage ||
	    type.basetype == SPIRType::Image)
	{
		// The image/sampler ID must be declared as non-uniform.
		// However, it is not legal GLSL to have
		// nonuniformEXT(samplers[index]), so we must move the nonuniform qualifier
		// to the array indexing, like
		// samplers[nonuniformEXT(index)].
		// While the access chain will generally be nonuniformEXT, it's not necessarily so,
		// so we might have to fixup the OpLoad-ed expression late.

		auto start_array_index = expr.find_first_of('[');
		auto end_array_index = expr.find_last_of(']');
		// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
		// nothing we can do here to express that.
		if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
			return;

		start_array_index++;

		expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
		            expr.substr(start_array_index, end_array_index - start_array_index), ")",
		            expr.substr(end_array_index, string::npos));
	}
}